

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randr-event.c
# Opt level: O3

natwm_error handle_randr_event(natwm_state *state,xcb_generic_event_t *event,uint8_t event_type)

{
  byte bVar1;
  undefined7 in_register_00000011;
  char *fmt;
  
  bVar1 = state->monitor_list->extension->data_cache->first_event;
  if (bVar1 + 1 == (int)CONCAT71(in_register_00000011,event_type)) {
    fmt = "Handle notify";
  }
  else {
    if (bVar1 != event_type) {
      return NO_ERROR;
    }
    fmt = "Handle screen change";
  }
  internal_logger(natwm_logger,LEVEL_INFO,fmt);
  return NO_ERROR;
}

Assistant:

enum natwm_error handle_randr_event(const struct natwm_state *state,
                                    const xcb_generic_event_t *event, uint8_t event_type)
{
        const xcb_query_extension_reply_t *cache = state->monitor_list->extension->data_cache;

        if (event_type == (cache->first_event + XCB_RANDR_NOTIFY)) {
                return handle_randr_notify_event(state, (const xcb_randr_notify_event_t *)event);
        }

        if (event_type == (cache->first_event + XCB_RANDR_SCREEN_CHANGE_NOTIFY)) {
                return handle_randr_screen_change_event(
                        state, (const xcb_randr_screen_change_notify_event_t *)event);
        }

        return NO_ERROR;
}